

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeMemClearAndResize(Mem *pMem,int szNew)

{
  int iVar1;
  
  if (pMem->szMalloc < szNew) {
    iVar1 = sqlite3VdbeMemGrow(pMem,szNew,0);
    return iVar1;
  }
  pMem->z = pMem->zMalloc;
  pMem->flags = pMem->flags & 0xd;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemClearAndResize(Mem *pMem, int szNew){
  assert( CORRUPT_DB || szNew>0 );
  assert( (pMem->flags & MEM_Dyn)==0 || pMem->szMalloc==0 );
  if( pMem->szMalloc<szNew ){
    return sqlite3VdbeMemGrow(pMem, szNew, 0);
  }
  assert( (pMem->flags & MEM_Dyn)==0 );
  pMem->z = pMem->zMalloc;
  pMem->flags &= (MEM_Null|MEM_Int|MEM_Real);
  return SQLITE_OK;
}